

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<pybind11::detail::value_and_holder&,SupportType,unsigned_short,long>::
load_impl_sequence<0ul,1ul,2ul,3ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  __tuple_element_t<3UL,_tuple<type_caster<value_and_holder>,_type_caster<SupportType,_void>,_type_caster<unsigned_short,_void>,_type_caster<long,_void>_>_>
  *__n;
  const_iterator pbVar2;
  reference rVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 uVar4;
  type_caster_generic *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  const_iterator local_a0;
  reference local_98;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 convert;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  convert = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  uVar4 = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<SupportType,void>,pybind11::detail::type_caster<unsigned_short,void>,pybind11::detail::type_caster<long,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<SupportType,_void>,_pybind11::detail::type_caster<unsigned_short,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x3b6b89);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_34 = type_caster<pybind11::detail::value_and_holder,_void>::load
                       ((type_caster<pybind11::detail::value_and_holder,_void> *)
                        in_stack_ffffffffffffff38,(handle)param_1,(bool)uVar4);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<SupportType,void>,pybind11::detail::type_caster<unsigned_short,void>,pybind11::detail::type_caster<long,void>>
                   ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<SupportType,_void>,_pybind11::detail::type_caster<unsigned_short,_void>,_pybind11::detail::type_caster<long,_void>_>
                     *)0x3b6c09);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_33 = type_caster_generic::load
                       (in_stack_ffffffffffffff38,(handle)param_1,SUB81((ulong)this >> 0x38,0));
  std::
  get<2ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<SupportType,void>,pybind11::detail::type_caster<unsigned_short,void>,pybind11::detail::type_caster<long,void>>
            ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<SupportType,_void>,_pybind11::detail::type_caster<unsigned_short,_void>,_pybind11::detail::type_caster<long,_void>_>
              *)0x3b6c84);
  std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
            ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),2);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
  std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffff80);
  local_32 = type_caster<unsigned_short,_void>::load
                       ((type_caster<unsigned_short,_void> *)rVar3._M_p,(PyObject *)rVar3._M_mask,
                        (bool)convert);
  __n = std::
        get<3ul,pybind11::detail::type_caster<pybind11::detail::value_and_holder,void>,pybind11::detail::type_caster<SupportType,void>,pybind11::detail::type_caster<unsigned_short,void>,pybind11::detail::type_caster<long,void>>
                  ((tuple<pybind11::detail::type_caster<pybind11::detail::value_and_holder,_void>,_pybind11::detail::type_caster<SupportType,_void>,_pybind11::detail::type_caster<unsigned_short,_void>,_pybind11::detail::type_caster<long,_void>_>
                    *)0x3b6cf9);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      3);
  uVar4 = (undefined1)((ulong)pvVar1->m_ptr >> 0x38);
  local_98 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),(size_type)__n
                       );
  std::_Bit_reference::operator_cast_to_bool(&local_98);
  local_31 = type_caster<long,_void>::load
                       ((type_caster<long,_void> *)rVar3._M_p,(PyObject *)rVar3._M_mask,(bool)uVar4)
  ;
  local_30._M_array = &local_34;
  local_30._M_len = 4;
  local_20 = &local_30;
  local_a0 = std::initializer_list<bool>::begin(local_20);
  pbVar2 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_a0 == pbVar2) {
      return true;
    }
    if ((*local_a0 & 1U) == 0) break;
    local_a0 = local_a0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }